

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::NewScObjectNoArgNoCtorCommon
              (Var instance,ScriptContext *requestContext,bool isBaseClassConstructorNewScObject)

{
  code *pcVar1;
  bool bVar2;
  RecyclableObject *function;
  FunctionInfo *functionInfo;
  Var pvVar3;
  undefined4 *puVar4;
  char *message;
  char *error;
  uint lineNumber;
  
  function = VarTo<Js::RecyclableObject>(instance);
  functionInfo = GetConstructorFunctionInfo(instance,requestContext);
  if (functionInfo == (FunctionInfo *)JavascriptObject::EntryInfo::NewInstance) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(functionInfo != &JavascriptObject::EntryInfo::NewInstance)";
    message = "functionInfo != &JavascriptObject::EntryInfo::NewInstance";
    lineNumber = 0x18a5;
  }
  else {
    if (functionInfo != (FunctionInfo *)JavascriptArray::EntryInfo::NewInstance) {
      if (functionInfo == (FunctionInfo *)0x0) {
        pvVar3 = NewScObjectHostDispatchOrProxy(function,requestContext);
        return pvVar3;
      }
      goto LAB_009a2467;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(functionInfo != &JavascriptArray::EntryInfo::NewInstance)";
    message = "functionInfo != &JavascriptArray::EntryInfo::NewInstance";
    lineNumber = 0x18a6;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                              ,lineNumber,error,message);
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_009a2467:
  pvVar3 = NewScObjectCommon(function,functionInfo,requestContext,isBaseClassConstructorNewScObject)
  ;
  return pvVar3;
}

Assistant:

Var JavascriptOperators::NewScObjectNoArgNoCtorCommon(Var instance, ScriptContext* requestContext, bool isBaseClassConstructorNewScObject)
    {
        RecyclableObject * object = VarTo<RecyclableObject>(instance);
        FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(instance, requestContext);
        Assert(functionInfo != &JavascriptObject::EntryInfo::NewInstance); // built-ins are not inlined
        Assert(functionInfo != &JavascriptArray::EntryInfo::NewInstance); // built-ins are not inlined

        return functionInfo != nullptr ?
            JavascriptOperators::NewScObjectCommon(object, functionInfo, requestContext, isBaseClassConstructorNewScObject) :
            JavascriptOperators::NewScObjectHostDispatchOrProxy(object, requestContext);
    }